

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeCube>::Shape
          (TPZCompElH1<pzshape::TPZShapeCube> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  byte bVar1;
  int iVar2;
  TPZGeoNode *this_00;
  long *plVar3;
  TPZConnect *this_01;
  long *in_RDI;
  TPZGeoEl *ref;
  int i;
  TPZManVector<int,_20> ord;
  TPZManVector<long,_8> id;
  TPZFMatrix<double> *in_stack_000015b0;
  TPZFMatrix<double> *in_stack_000015b8;
  TPZVec<int> *in_stack_000015c0;
  TPZVec<long> *in_stack_000015c8;
  TPZVec<double> *in_stack_000015d0;
  TPZManVector<int,_20> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  TPZGeoEl *in_stack_fffffffffffffeb0;
  long *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  TPZManVector<int,_20> *in_stack_fffffffffffffed0;
  int local_110;
  TPZVec<int> local_f8 [3];
  undefined8 local_88;
  TPZVec<long> local_80 [4];
  
  local_88 = 0;
  TPZManVector<long,_8>::TPZManVector
            ((TPZManVector<long,_8> *)in_stack_fffffffffffffed0,
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0
            );
  TPZManVector<int,_20>::TPZManVector
            (in_stack_fffffffffffffed0,CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
             ,(int *)in_stack_fffffffffffffec0);
  TPZCompEl::Reference((TPZCompEl *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  for (local_110 = 0; local_110 < 8; local_110 = local_110 + 1) {
    this_00 = TPZGeoEl::NodePtr(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    iVar2 = TPZGeoNode::Id(this_00);
    plVar3 = TPZVec<long>::operator[](local_80,(long)local_110);
    *plVar3 = (long)iVar2;
  }
  for (local_110 = 0; local_110 < 0x13; local_110 = local_110 + 1) {
    this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_110 + 8);
    bVar1 = TPZConnect::Order(this_01);
    in_stack_fffffffffffffea0 =
         (TPZManVector<int,_20> *)TPZVec<int>::operator[](local_f8,(long)local_110);
    *(uint *)&(in_stack_fffffffffffffea0->super_TPZVec<int>)._vptr_TPZVec = (uint)bVar1;
  }
  pzshape::TPZShapeCube::Shape
            (in_stack_000015d0,in_stack_000015c8,in_stack_000015c0,in_stack_000015b8,
             in_stack_000015b0);
  TPZManVector<int,_20>::~TPZManVector(in_stack_fffffffffffffea0);
  TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
	TPZManVector<int64_t,TSHAPE::NCornerNodes> id(TSHAPE::NCornerNodes,0);
	TPZManVector<int, TSHAPE::NSides-TSHAPE::NCornerNodes+1> ord(TSHAPE::NSides-TSHAPE::NCornerNodes,0);
	int i;
	TPZGeoEl *ref = this->Reference();
	for(i=0; i<TSHAPE::NCornerNodes; i++) {
		id[i] = ref->NodePtr(i)->Id();
	}
	for(i=0; i<TSHAPE::NSides-TSHAPE::NCornerNodes; i++) {
		ord[i] = this->Connect(i+TSHAPE::NCornerNodes).Order();
	}
	TSHAPE::Shape(pt,id,ord,phi,dphi);
}